

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# choc_StringUtilities.h
# Opt level: O1

string * choc::text::addDoubleQuotes(string *__return_storage_ptr__,string *text)

{
  long lVar1;
  long *plVar2;
  long *plVar3;
  size_type *psVar4;
  long *local_30;
  long local_28;
  long local_20;
  long lStack_18;
  
  plVar2 = (long *)std::__cxx11::string::replace((ulong)text,0,(char *)0x0,0x28820a);
  plVar3 = plVar2 + 2;
  if ((long *)*plVar2 == plVar3) {
    local_20 = *plVar3;
    lStack_18 = plVar2[3];
    local_30 = &local_20;
  }
  else {
    local_20 = *plVar3;
    local_30 = (long *)*plVar2;
  }
  local_28 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_30);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar4 = (size_type *)(plVar2 + 2);
  if ((size_type *)*plVar2 == psVar4) {
    lVar1 = plVar2[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar4;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar1;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar2;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar4;
  }
  __return_storage_ptr__->_M_string_length = plVar2[1];
  *plVar2 = (long)psVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  if (local_30 != &local_20) {
    operator_delete(local_30,local_20 + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::string addDoubleQuotes (std::string text)          { return "\"" + std::move (text) + "\""; }